

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

void __thiscall
google::protobuf::DynamicMessageFactory::~DynamicMessageFactory(DynamicMessageFactory *this)

{
  _Node **pp_Var1;
  TypeInfo *this_00;
  PrototypeMap *pPVar2;
  _Node **pp_Var3;
  _Hash_node<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false>
  *p_Var4;
  
  (this->super_MessageFactory)._vptr_MessageFactory =
       (_func_int **)&PTR__DynamicMessageFactory_00290bf0;
  pPVar2 = (this->prototypes_).ptr_;
  if (pPVar2 != (PrototypeMap *)0x0) {
    pp_Var3 = (pPVar2->map_).
              super_unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>_>
              .
              super___unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_false>
              .
              super__Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_buckets;
    p_Var4 = *pp_Var3;
    while (p_Var4 == (_Node *)0x0) {
      pp_Var1 = pp_Var3 + 1;
      pp_Var3 = pp_Var3 + 1;
      p_Var4 = *pp_Var1;
    }
    do {
      if (p_Var4 == (pPVar2->map_).
                    super_unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>_>
                    .
                    super___unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_false>
                    .
                    super__Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                    ._M_buckets
                    [(pPVar2->map_).
                     super_unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>_>
                     .
                     super___unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_false>
                     .
                     super__Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                     ._M_bucket_count]) {
        internal::Mutex::~Mutex(&this->prototypes_mutex_);
        internal::scoped_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap>::~scoped_ptr
                  (&this->prototypes_);
        MessageFactory::~MessageFactory(&this->super_MessageFactory);
        return;
      }
      this_00 = (p_Var4->_M_v).second;
      if (this_00 != (TypeInfo *)0x0) {
        DynamicMessage::TypeInfo::~TypeInfo(this_00);
      }
      operator_delete(this_00,0x40);
      p_Var4 = p_Var4->_M_next;
      while (p_Var4 == (_Hash_node<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false>
                        *)0x0) {
        pp_Var1 = pp_Var3 + 1;
        pp_Var3 = pp_Var3 + 1;
        p_Var4 = *pp_Var1;
      }
      pPVar2 = (this->prototypes_).ptr_;
    } while (pPVar2 != (PrototypeMap *)0x0);
  }
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                ,0x1e2,
                "C *google::protobuf::internal::scoped_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap>::operator->() const [C = google::protobuf::DynamicMessageFactory::PrototypeMap]"
               );
}

Assistant:

DynamicMessageFactory::~DynamicMessageFactory() {
  for (PrototypeMap::Map::iterator iter = prototypes_->map_.begin();
       iter != prototypes_->map_.end(); ++iter) {
    delete iter->second;
  }
}